

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFeaturePrint.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::CoreMLModels::AudioFeaturePrint_Sound::~AudioFeaturePrint_Sound
          (AudioFeaturePrint_Sound *this)

{
  ~AudioFeaturePrint_Sound(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

AudioFeaturePrint_Sound::~AudioFeaturePrint_Sound() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.CoreMLModels.AudioFeaturePrint.Sound)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}